

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btorsplit.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  char *__s1;
  pointer pcVar1;
  _Hash_node_base *p_Var2;
  __node_base_ptr p_Var3;
  _Hash_node_base *p_Var4;
  __node_base _Var5;
  _Alloc_hider _Var6;
  size_type sVar7;
  bool bVar8;
  char cVar9;
  ostream oVar10;
  int iVar11;
  ostream *poVar12;
  istream *piVar13;
  __node_base_ptr p_Var14;
  undefined8 extraout_RAX;
  pointer pbVar15;
  size_type sVar16;
  __node_base_ptr p_Var17;
  __hash_code __code;
  _Hash_node_base *p_Var18;
  ostream *poVar19;
  ulong uVar20;
  ulong uVar21;
  bool bVar22;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  lines;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  infiles;
  string line;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> infile;
  string outfilename;
  unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
  bad;
  string suffix;
  string prefix;
  stringstream ss;
  ofstream outfile;
  ifstream infile_1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_738;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_718;
  long local_700;
  value_type local_6f8;
  char *local_6d8;
  long local_6d0;
  char local_6c8 [16];
  pointer local_6b8;
  pointer local_6b0;
  undefined8 local_6a8;
  _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  *local_6a0;
  undefined1 *local_698 [2];
  undefined1 local_688 [16];
  char *local_678 [2];
  char local_668 [16];
  _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  local_658;
  char *local_620;
  long local_618;
  char local_610 [16];
  char *local_600;
  long local_5f8;
  char local_5f0 [16];
  char *local_5e0;
  long local_5d8;
  char local_5d0 [16];
  long local_5c0 [2];
  ostream local_5b0 [112];
  ios_base local_540 [264];
  undefined1 local_438 [248];
  ios_base local_340 [264];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_238 [16];
  
  local_718.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_718.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_718.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (argc < 2) {
    bVar8 = false;
  }
  else {
    uVar20 = 1;
    bVar8 = false;
    do {
      __s1 = argv[uVar20];
      iVar11 = strcmp(__s1,"-v");
      if (iVar11 == 0) {
        s_verbosity = s_verbosity + 1;
      }
      else {
        iVar11 = strcmp(__s1,"-f");
        if (iVar11 == 0) {
          bVar8 = true;
        }
        else {
          iVar11 = strcmp(__s1,"-h");
          if ((iVar11 == 0) || (iVar11 = strcmp(__s1,"--help"), iVar11 == 0)) {
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Usage:",6);
            std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x10);
            std::ostream::put(-0x10);
            std::ostream::flush();
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,"  btorsplit [options] BTOR2_FILE...\n",0x24);
            std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x10);
            std::ostream::put(-0x10);
            std::ostream::flush();
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Options:",8);
            std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x10);
            std::ostream::put(-0x10);
            std::ostream::flush();
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,"  -h,--help   Print this help and exit.",0x27);
            std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x10);
            std::ostream::put(-0x10);
            std::ostream::flush();
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,"  -v          Increase verbosity.",0x21);
            std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x10);
            std::ostream::put(-0x10);
            std::ostream::flush();
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,
                       "  -f          Overwrite output file if it already exists.",0x39);
            std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x10);
            std::ostream::put(-0x10);
            std::ostream::flush();
            std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x10);
            std::ostream::put(-0x10);
            std::ostream::flush();
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,
                       "Split multi-property BTOR2 files into single property files. For each\nproperty a new file \'<basename>p[0-9]+.btor is generated"
                       ,0x7e);
            std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x10);
            std::ostream::put(-0x10);
            std::ostream::flush();
            goto LAB_00103f74;
          }
          std::__cxx11::string::string((string *)local_238,__s1,(allocator *)local_438);
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_718
                     ,local_238);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_238[0]._M_dataplus._M_p != &local_238[0].field_2) {
            operator_delete(local_238[0]._M_dataplus._M_p);
          }
        }
      }
      uVar20 = uVar20 + 1;
    } while ((uint)argc != uVar20);
  }
  if (local_718.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      local_718.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
LAB_00103fa8:
    die("No BTOR2 input file(s) specified.");
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_238[0]._M_dataplus._M_p != &local_238[0].field_2) {
      operator_delete(local_238[0]._M_dataplus._M_p);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_718);
    _Unwind_Resume(extraout_RAX);
  }
  local_6b8 = local_718.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
  if (local_718.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_718.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    local_6a0 = _VTT;
    local_6a8 = __filebuf;
    pbVar15 = local_718.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    do {
      local_6d8 = local_6c8;
      pcVar1 = (pbVar15->_M_dataplus)._M_p;
      local_6b0 = pbVar15;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_6d8,pcVar1,pcVar1 + pbVar15->_M_string_length);
      if (s_verbosity != 0) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Processing ",0xb);
        poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&std::cout,local_6d8,local_6d0);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar12 + -0x18) + (char)poVar12);
        std::ostream::put((char)poVar12);
        std::ostream::flush();
      }
      local_698[0] = local_688;
      std::__cxx11::string::_M_construct<char*>((string *)local_698,local_6d8,local_6d8 + local_6d0)
      ;
      std::ifstream::ifstream(local_238,(string *)local_698,_S_in);
      local_738.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_738.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_738.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_658._M_buckets = &local_658._M_single_bucket;
      local_658._M_bucket_count = 1;
      local_658._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
      local_658._M_element_count = 0;
      local_658._M_rehash_policy._M_max_load_factor = 1.0;
      local_658._M_rehash_policy._M_next_resize = 0;
      local_658._M_single_bucket = (__node_base_ptr)0x0;
      local_6f8._M_dataplus._M_p = (pointer)&local_6f8.field_2;
      local_6f8._M_string_length = 0;
      local_6f8.field_2._M_local_buf[0] = '\0';
      while( true ) {
        cVar9 = std::ios::widen((char)*(undefined8 *)(local_238[0]._M_dataplus._M_p + -0x18) +
                                (char)local_238);
        piVar13 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                            ((istream *)local_238,(string *)&local_6f8,cVar9);
        sVar7 = local_6f8._M_string_length;
        _Var6._M_p = local_6f8._M_dataplus._M_p;
        if (((byte)piVar13[*(long *)(*(long *)piVar13 + -0x18) + 0x20] & 5) != 0) break;
        if ((local_6f8._M_string_length != 0) && ((int)*local_6f8._M_dataplus._M_p - 0x30U < 10)) {
          uVar20 = 0;
          do {
            uVar21 = uVar20;
            if (9 < (int)local_6f8._M_dataplus._M_p[uVar20] - 0x30U) break;
            uVar20 = uVar20 + 1;
            uVar21 = local_6f8._M_string_length;
          } while (local_6f8._M_string_length != uVar20);
          uVar20 = uVar21;
          if (uVar21 < local_6f8._M_string_length) {
            do {
              iVar11 = isspace((int)_Var6._M_p[uVar21]);
              uVar20 = uVar21;
              if (iVar11 == 0) break;
              uVar21 = uVar21 + 1;
              uVar20 = sVar7;
            } while (sVar7 != uVar21);
          }
          if ((((uVar20 + 3 < sVar7) && (_Var6._M_p[uVar20] == 'b')) &&
              (_Var6._M_p[uVar20 + 1] == 'a')) &&
             ((_Var6._M_p[uVar20 + 2] == 'd' &&
              (iVar11 = isspace((int)_Var6._M_p[uVar20 + 3]), iVar11 != 0)))) {
            local_5c0[0] = (long)local_738.
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                           (long)local_738.
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start >> 5;
            local_438._0_8_ = &local_658;
            std::
            _Hashtable<unsigned_long,unsigned_long,std::allocator<unsigned_long>,std::__detail::_Identity,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
            ::
            _M_insert<unsigned_long,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<unsigned_long,false>>>>
                      ((_Hashtable<unsigned_long,unsigned_long,std::allocator<unsigned_long>,std::__detail::_Identity,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                        *)local_438._0_8_,local_5c0,local_438);
          }
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(&local_738,&local_6f8);
      }
      if (local_658._M_element_count < 2) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"Found only one property. Nothing to split",0x29);
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x10);
        std::ostream::put(-0x10);
        std::ostream::flush();
      }
      else {
        std::__cxx11::string::rfind((char *)local_698,0x105034,0xffffffffffffffff);
        std::__cxx11::string::substr((ulong)&local_5e0,(ulong)local_698);
        std::__cxx11::string::substr((ulong)&local_600,(ulong)local_698);
        if (s_verbosity != 0) {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Found ",6);
          poVar12 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
          std::__ostream_insert<char,std::char_traits<char>>(poVar12," properties in ",0xf);
          poVar12 = std::ostream::_M_insert<unsigned_long>((ulong)poVar12);
          std::__ostream_insert<char,std::char_traits<char>>(poVar12," lines",6);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar12 + -0x18) + (char)poVar12);
          std::ostream::put((char)poVar12);
          std::ostream::flush();
        }
        _Var5._M_nxt = local_658._M_before_begin._M_nxt;
        if (local_658._M_element_count == 0) {
          local_700 = 0;
        }
        else {
          iVar11 = 0;
          sVar16 = local_658._M_element_count;
          do {
            iVar11 = iVar11 + 1;
            bVar22 = 9 < sVar16;
            sVar16 = sVar16 / 10;
          } while (bVar22);
          local_700 = (long)iVar11;
        }
        for (; _Var5._M_nxt != (_Hash_node_base *)0x0; _Var5._M_nxt = (_Var5._M_nxt)->_M_nxt) {
          p_Var2 = _Var5._M_nxt[1]._M_nxt;
          std::__cxx11::stringstream::stringstream((stringstream *)local_5c0);
          poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                              (local_5b0,local_5e0,local_5d8);
          std::__ostream_insert<char,std::char_traits<char>>(poVar12,"-p",2);
          poVar19 = poVar12 + *(long *)(*(long *)poVar12 + -0x18);
          if (poVar12[*(long *)(*(long *)poVar12 + -0x18) + 0xe1] == (ostream)0x0) {
            oVar10 = (ostream)std::ios::widen((char)poVar19);
            poVar19[0xe0] = oVar10;
            poVar19[0xe1] = (ostream)0x1;
          }
          poVar19[0xe0] = (ostream)0x30;
          *(long *)(poVar12 + *(long *)(*(long *)poVar12 + -0x18) + 0x10) = local_700;
          poVar12 = std::ostream::_M_insert<unsigned_long>((ulong)poVar12);
          std::__ostream_insert<char,std::char_traits<char>>(poVar12,local_600,local_5f8);
          std::__cxx11::stringbuf::str();
          if ((!bVar8) && (iVar11 = stat(local_678[0],(stat *)local_438), iVar11 != -1)) {
            die("Output file %s already exists. Delete or use -f to overwrite",local_678[0]);
            goto LAB_00103fa8;
          }
          std::ofstream::ofstream(local_438,(string *)local_678,_S_out);
          if (local_738.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish !=
              local_738.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start) {
            p_Var18 = (_Hash_node_base *)0x0;
            do {
              p_Var3 = local_658._M_buckets[(ulong)p_Var18 % local_658._M_bucket_count];
              p_Var14 = (__node_base_ptr)0x0;
              if ((p_Var3 != (__node_base_ptr)0x0) &&
                 (p_Var14 = p_Var3, p_Var17 = p_Var3->_M_nxt, p_Var18 != p_Var3->_M_nxt[1]._M_nxt))
              {
                while (p_Var4 = p_Var17->_M_nxt, p_Var4 != (_Hash_node_base *)0x0) {
                  p_Var14 = (__node_base_ptr)0x0;
                  if (((ulong)p_Var4[1]._M_nxt % local_658._M_bucket_count !=
                       (ulong)p_Var18 % local_658._M_bucket_count) ||
                     (p_Var14 = p_Var17, p_Var17 = p_Var4, p_Var18 == p_Var4[1]._M_nxt))
                  goto LAB_00103adc;
                }
                p_Var14 = (__node_base_ptr)0x0;
              }
LAB_00103adc:
              if (p_Var14 == (__node_base_ptr)0x0) {
                bVar22 = true;
              }
              else {
                bVar22 = p_Var14->_M_nxt == (_Hash_node_base *)0x0;
              }
              if ((bVar22) || (p_Var2 == p_Var18)) {
                poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)local_438,
                                     local_738.
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start[(long)p_Var18].
                                     _M_dataplus._M_p,
                                     local_738.
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start[(long)p_Var18].
                                     _M_string_length);
                std::ios::widen((char)*(undefined8 *)(*(long *)poVar12 + -0x18) + (char)poVar12);
                std::ostream::put((char)poVar12);
                std::ostream::flush();
              }
              p_Var18 = (_Hash_node_base *)((long)&p_Var18->_M_nxt + 1);
            } while (p_Var18 < (_Hash_node_base *)
                               ((long)local_738.
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                                (long)local_738.
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start >> 5));
          }
          std::ofstream::close();
          if (s_verbosity != 0) {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,"Generated ",10);
            std::__cxx11::stringbuf::str();
            poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)&std::cout,local_620,local_618);
            std::ios::widen((char)*(undefined8 *)(*(long *)poVar12 + -0x18) + (char)poVar12);
            std::ostream::put((char)poVar12);
            std::ostream::flush();
            if (local_620 != local_610) {
              operator_delete(local_620);
            }
          }
          local_438._0_8_ = local_6a0;
          *(undefined8 *)(local_438 + *(long *)&local_6a0[-1]._M_rehash_policy) = local_6a8;
          std::filebuf::~filebuf((filebuf *)(local_438 + 8));
          std::ios_base::~ios_base(local_340);
          if (local_678[0] != local_668) {
            operator_delete(local_678[0]);
          }
          std::__cxx11::stringstream::~stringstream((stringstream *)local_5c0);
          std::ios_base::~ios_base(local_540);
        }
        if (local_600 != local_5f0) {
          operator_delete(local_600);
        }
        if (local_5e0 != local_5d0) {
          operator_delete(local_5e0);
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_6f8._M_dataplus._M_p != &local_6f8.field_2) {
        operator_delete(local_6f8._M_dataplus._M_p);
      }
      std::
      _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
      ::~_Hashtable(&local_658);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_738);
      std::ifstream::~ifstream(local_238);
      if (local_698[0] != local_688) {
        operator_delete(local_698[0]);
      }
      if (local_6d8 != local_6c8) {
        operator_delete(local_6d8);
      }
      pbVar15 = local_6b0 + 1;
    } while (pbVar15 != local_6b8);
  }
LAB_00103f74:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_718);
  return 0;
}

Assistant:

int
main(int argc, char *argv[])
{
  bool overwrite = false;
  std::vector<std::string> infiles;

  for (int i = 1; i < argc; ++i)
  {
    if (!strcmp(argv[i], "-v"))
    {
      ++s_verbosity;
    }
    else if (!strcmp(argv[i], "-f"))
    {
      overwrite = true;
    }
    else if (!strcmp(argv[i], "-h") || !strcmp(argv[i], "--help"))
    {
      print_usage();
      return EXIT_SUCCESS;
    }
    else
    {
      infiles.push_back(std::string(argv[i]));
    }
  }

  if (infiles.empty())
  {
    die("No BTOR2 input file(s) specified.");
  }

  for (auto infile : infiles)
  {
    if (s_verbosity) std::cout << "Processing " << infile << std::endl;
    split_file(infile, overwrite);
  }

  return EXIT_SUCCESS;
}